

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setNewWindowTitle(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowTitle((QString *)&local_58,pQVar2);
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    originalWindowTitle((QString *)&local_78,this);
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
      this->ignoreWindowTitleChange = true;
      pQVar2 = QWidget::window(pQVar2);
      QWidget::setWindowTitle(pQVar2,(QString *)&local_58);
      this->ignoreWindowTitleChange = false;
    }
    else {
      QMdiSubWindow::tr((QString *)&local_b0,"- [%1]",(char *)0x0,-1);
      QString::arg<QString,_true>
                ((QString *)&local_98,(QString *)&local_b0,(QString *)&local_58,0,(QChar)0x20);
      bVar1 = QString::contains((QString *)&local_78,(QString *)&local_98,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (!bVar1) {
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QMdiSubWindow::tr((QString *)&local_b0,"%1 - [%2]",(char *)0x0,-1);
        QString::arg<QString&,QString&>
                  ((type *)&local_98,(QString *)&local_b0,(QString *)&local_78,(QString *)&local_58)
        ;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        this->ignoreWindowTitleChange = true;
        pQVar2 = QWidget::window(pQVar2);
        QWidget::setWindowTitle(pQVar2,(QString *)&local_98);
        this->ignoreWindowTitleChange = false;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setNewWindowTitle()
{
    Q_Q(QMdiSubWindow);
    QString childTitle = q->windowTitle();
    if (childTitle.isEmpty())
        return;
    QString original = originalWindowTitle();
    if (!original.isEmpty()) {
        if (!original.contains(QMdiSubWindow::tr("- [%1]").arg(childTitle))) {
            auto title = QMdiSubWindow::tr("%1 - [%2]").arg(original, childTitle);
            ignoreWindowTitleChange = true;
            q->window()->setWindowTitle(title);
            ignoreWindowTitleChange = false;
        }

    } else {
        ignoreWindowTitleChange = true;
        q->window()->setWindowTitle(childTitle);
        ignoreWindowTitleChange = false;
    }
}